

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

undefined8 __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
::dump(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
       *this,int indent)

{
  int iVar1;
  DecimalSeparator *this_00;
  int in_EDX;
  undefined8 in_RDI;
  uint in_stack_0000003c;
  uint in_stack_00000040;
  bool in_stack_00000047;
  stringstream ss;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  *in_stack_00000050;
  locale in_stack_fffffffffffffe40;
  locale *in_stack_fffffffffffffe48;
  locale *in_stack_fffffffffffffe50;
  locale local_1a8;
  long local_1a0 [49];
  int local_14;
  
  local_14 = in_EDX;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
  if (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
      ::dump(int)::loc == '\0') {
    iVar1 = __cxa_guard_acquire(&basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
                                 ::dump(int)::loc);
    if (iVar1 != 0) {
      std::locale::locale(&local_1a8);
      this_00 = (DecimalSeparator *)operator_new(0x18);
      anon_unknown_3::DecimalSeparator::DecimalSeparator(this_00);
      std::locale::locale<nlohmann::(anonymous_namespace)::DecimalSeparator>
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                 (DecimalSeparator *)in_stack_fffffffffffffe40._M_impl);
      std::locale::~locale(&local_1a8);
      __cxa_atexit(std::locale::~locale,&dump::loc,&__dso_handle);
      __cxa_guard_release(&basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
                           ::dump(int)::loc);
    }
  }
  std::ios::imbue((locale *)&stack0xfffffffffffffe40);
  std::locale::~locale((locale *)&stack0xfffffffffffffe40);
  std::ios_base::precision((ios_base *)((long)local_1a0 + *(long *)(local_1a0[0] + -0x18)),0xf);
  if (local_14 < 0) {
    dump(in_stack_00000050,_ss,in_stack_00000047,in_stack_00000040,in_stack_0000003c);
  }
  else {
    dump(in_stack_00000050,_ss,in_stack_00000047,in_stack_00000040,in_stack_0000003c);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  return in_RDI;
}

Assistant:

string_t dump(const int indent = -1) const
    {
        std::stringstream ss;
        // fix locale problems
        const static std::locale loc(std::locale(), new DecimalSeparator);
        ss.imbue(loc);

        // 6, 15 or 16 digits of precision allows round-trip IEEE 754
        // string->float->string, string->double->string or string->long
        // double->string; to be safe, we read this value from
        // std::numeric_limits<number_float_t>::digits10
        ss.precision(std::numeric_limits<double>::digits10);

        if (indent >= 0)
        {
            dump(ss, true, static_cast<unsigned int>(indent));
        }
        else
        {
            dump(ss, false, 0);
        }

        return ss.str();
    }